

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

void stop_openssh_fixture(void)

{
  if (running_container_id == (char *)0x0) {
    if (have_docker != 0) {
      fprintf(_stderr,"Cannot stop container - none started\n");
    }
  }
  else {
    stop_openssh_server(running_container_id);
    free(running_container_id);
    running_container_id = (char *)0x0;
  }
  return;
}

Assistant:

void stop_openssh_fixture(void)
{
    if(running_container_id) {
        stop_openssh_server(running_container_id);
        free(running_container_id);
        running_container_id = NULL;
    }
    else if(have_docker) {
        fprintf(stderr, "Cannot stop container - none started\n");
    }

#ifdef _WIN32
    WSACleanup();
#endif
}